

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_2cfb1b::ClangShellCommand::configureAttribute
          (ClangShellCommand *this,ConfigureContext *ctx,StringRef name,StringRef value)

{
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *this_00;
  pointer pSVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  char *pcVar4;
  size_t sVar5;
  StringRef value_local;
  string local_48;
  
  sVar5 = value.Length;
  pcVar4 = value.Data;
  value_local.Data = pcVar4;
  value_local.Length = sVar5;
  if (name.Length == 4) {
    if (*(int *)name.Data == 0x73677261) {
      this_00 = &this->args;
      pSVar1 = (this->args).super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((this->args).super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl
          .super__Vector_impl_data._M_finish != pSVar1) {
        (this->args).super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
        super__Vector_impl_data._M_finish = pSVar1;
      }
      iVar3 = (*ctx->delegate->_vptr_BuildFileDelegate[2])
                        (ctx->delegate,llbuild::basic::DefaultShellPath_abi_cxx11_,DAT_00232a88);
      local_48._M_dataplus._M_p = (pointer)CONCAT44(extraout_var,iVar3);
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::emplace_back<llvm::StringRef>
                (this_00,(StringRef *)&local_48);
      iVar3 = (*ctx->delegate->_vptr_BuildFileDelegate[2])(ctx->delegate,"-c",2);
      local_48._M_dataplus._M_p = (pointer)CONCAT44(extraout_var_00,iVar3);
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::emplace_back<llvm::StringRef>
                (this_00,(StringRef *)&local_48);
      iVar3 = (*ctx->delegate->_vptr_BuildFileDelegate[2])(ctx->delegate,pcVar4,sVar5);
      local_48._M_dataplus._M_p = (pointer)CONCAT44(extraout_var_01,iVar3);
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::emplace_back<llvm::StringRef>
                (this_00,(StringRef *)&local_48);
    }
    else {
      if (*(int *)name.Data != 0x73706564) goto LAB_00179926;
      llvm::StringRef::str_abi_cxx11_(&local_48,&value_local);
      std::__cxx11::string::operator=((string *)&this->depsPath,(string *)&local_48);
      std::__cxx11::string::_M_dispose();
    }
    return true;
  }
LAB_00179926:
  bVar2 = llbuild::buildsystem::ExternalCommand::configureAttribute
                    (&this->super_ExternalCommand,ctx,name,value);
  return bVar2;
}

Assistant:

virtual bool configureAttribute(const ConfigureContext& ctx, StringRef name,
                                  StringRef value) override {
    if (name == "args") {
      // When provided as a scalar string, we default to executing using the
      // shell.
      args.clear();
      args.push_back(ctx.getDelegate().getInternedString(DefaultShellPath));
      args.push_back(ctx.getDelegate().getInternedString("-c"));
      args.push_back(ctx.getDelegate().getInternedString(value));
    } else if (name == "deps") {
      depsPath = value;
    } else {
      return ExternalCommand::configureAttribute(ctx, name, value);
    }

    return true;
  }